

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O2

void __thiscall p2t::Sweep::FillBasinReq(Sweep *this,SweepContext *tcx,Node *node)

{
  double *pdVar1;
  double dVar2;
  Node *pNVar3;
  Node *pNVar4;
  Node *pNVar5;
  bool bVar6;
  Orientation OVar7;
  Point *pa;
  
  pa = (Point *)this;
  do {
    while( true ) {
      bVar6 = IsShallow((Sweep *)pa,tcx,node);
      if (bVar6) {
        return;
      }
      pa = (Point *)this;
      Fill(this,tcx,node);
      pNVar3 = node->next;
      pNVar4 = node->prev;
      pNVar5 = (tcx->basin).right_node;
      if (pNVar4 == (tcx->basin).left_node) break;
      if (pNVar3 == pNVar5) {
        pa = node->point;
        OVar7 = Orient2d(pa,pNVar4->point,pNVar4->prev->point);
        node = pNVar4;
        if (OVar7 == CCW) {
          return;
        }
      }
      else {
        dVar2 = pNVar3->point->y;
        pdVar1 = &pNVar4->point->y;
        node = pNVar4;
        if (dVar2 < *pdVar1 || dVar2 == *pdVar1) {
          node = pNVar3;
        }
      }
    }
    if (pNVar3 == pNVar5) {
      return;
    }
    pa = node->point;
    OVar7 = Orient2d(pa,pNVar3->point,pNVar3->next->point);
    node = pNVar3;
  } while (OVar7 != CW);
  return;
}

Assistant:

void Sweep::FillBasinReq(SweepContext& tcx, Node* node)
{
  // if shallow stop filling
  if (IsShallow(tcx, *node)) {
    return;
  }

  Fill(tcx, *node);

  if (node->prev == tcx.basin.left_node && node->next == tcx.basin.right_node) {
    return;
  } else if (node->prev == tcx.basin.left_node) {
    Orientation o = Orient2d(*node->point, *node->next->point, *node->next->next->point);
    if (o == CW) {
      return;
    }
    node = node->next;
  } else if (node->next == tcx.basin.right_node) {
    Orientation o = Orient2d(*node->point, *node->prev->point, *node->prev->prev->point);
    if (o == CCW) {
      return;
    }
    node = node->prev;
  } else {
    // Continue with the neighbor node with lowest Y value
    if (node->prev->point->y < node->next->point->y) {
      node = node->prev;
    } else {
      node = node->next;
    }
  }

  FillBasinReq(tcx, node);
}